

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O1

bool __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::solve
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this,ColVectorType *b,Heuristic heuristic
          )

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  long *plVar4;
  long lVar5;
  float *pfVar6;
  ulong uVar7;
  float *pfVar8;
  undefined8 uVar9;
  Index size;
  Index IVar10;
  long lVar11;
  char *__function;
  long lVar12;
  ulong uVar13;
  Index unaff_RBP;
  long lVar14;
  long lVar15;
  long lVar16;
  Scalar SVar17;
  float fVar18;
  float fVar19;
  ActualDstType actualDst;
  assign_op<float,_float> local_59;
  DenseStorage<float,__1,__1,_1,_0> *local_58;
  Heuristic local_4c;
  RowVectorType *local_48;
  Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>
  local_40;
  
  this->_num_ls = 0;
  local_58 = (DenseStorage<float,__1,__1,_1,_0> *)&this->_x;
  lVar14 = (this->_x).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  local_4c = heuristic;
  if (lVar14 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, 1>]"
                 );
  }
  if (lVar14 != 0) {
    memset((((RowVectorType *)local_58)->
           super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           lVar14 << 2);
  }
  lVar14 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
           m_storage.m_rows;
  if (0 < lVar14) {
    plVar4 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    lVar12 = 0;
    do {
      plVar4[lVar12] = lVar12;
      lVar12 = lVar12 + 1;
    } while (lVar14 != lVar12);
  }
  this->_Np = 0;
  if ((this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows !=
      (b->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Product.h"
                  ,0x62,
                  "Eigen::Product<Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, Eigen::Matrix<float, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, Rhs = Eigen::Matrix<float, -1, 1>, Option = 0]"
                 );
  }
  local_40.m_lhs.m_matrix = &this->_A;
  local_40.m_rhs = b;
  internal::
  call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<float,float>>
            (&this->_Atb,&local_40,&local_59,(type)0x0);
  _updateGradient(this);
  if ((this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols !=
      this->_Np) {
    local_48 = &this->_w;
    do {
      SVar17 = _max_Z(this,local_48);
      if (SVar17 < this->_epsilon) {
        return true;
      }
      if (local_4c == MAX_DESCENT) {
        IVar10 = _argmax_Z(this,local_48);
        _addToP(this,IVar10);
      }
      do {
        if ((0 < this->_max_iter) && (this->_max_iter <= this->_num_ls)) {
          return false;
        }
        _solveLS_P(this,b);
        lVar14 = this->_Np;
        if (lVar14 < 1) {
          lVar12 = 1;
          fVar19 = 3.4028235e+38;
        }
        else {
          lVar11 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>
                   .m_storage.m_rows;
          if (lVar11 < 1) {
            lVar11 = 0;
          }
          lVar16 = 0;
          IVar10 = unaff_RBP;
          lVar15 = 1;
          fVar18 = 3.4028235e+38;
          do {
            if (lVar11 == lVar16) goto LAB_0016bcdf;
            lVar5 = (this->_P).m_indices.
                    super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data
                    [lVar16];
            if ((lVar5 < 0) ||
               ((this->_y).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows <= lVar5)) goto LAB_0016bcc8;
            fVar3 = (this->_y).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data[lVar5];
            unaff_RBP = IVar10;
            lVar12 = lVar15;
            fVar19 = fVar18;
            if (fVar3 < 0.0) {
              if ((this->_x).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage
                  .m_rows <= lVar5) goto LAB_0016bcc8;
              fVar19 = (this->_x).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data[lVar5];
              fVar19 = -fVar19 / (fVar3 - fVar19);
              unaff_RBP = lVar16;
              lVar12 = 0;
              if (fVar18 <= fVar19) {
                unaff_RBP = IVar10;
                lVar12 = lVar15;
                fVar19 = fVar18;
              }
            }
            lVar16 = lVar16 + 1;
            IVar10 = unaff_RBP;
            lVar15 = lVar12;
            fVar18 = fVar19;
          } while (lVar14 != lVar16);
        }
        if (lVar12 == 0) {
          if (0 < lVar14) {
            plVar4 = (this->_P).m_indices.
                     super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data;
            pfVar6 = (this->_x).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            lVar11 = (this->_x).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            pfVar8 = (this->_y).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            lVar15 = 0;
            do {
              if ((this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows <= lVar15) goto LAB_0016bcdf;
              lVar16 = plVar4[lVar15];
              if (((lVar16 < 0) ||
                  ((this->_y).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows <= lVar16)) || (lVar11 <= lVar16)) goto LAB_0016bcc8;
              fVar18 = pfVar6[lVar16];
              pfVar6[lVar16] = (pfVar8[lVar16] - fVar18) * fVar19 + fVar18;
              lVar15 = lVar15 + 1;
            } while (lVar14 != lVar15);
          }
          _remFromP(this,unaff_RBP);
        }
        else {
          pfVar6 = (this->_y).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          uVar13 = (this->_y).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if ((this->_x).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows != uVar13) {
            if ((long)uVar13 < 0) {
              __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                            ,0x115,
                            "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, 1>]"
                           );
            }
            DenseStorage<float,_-1,_-1,_1,_0>::resize(local_58,uVar13,uVar13,1);
          }
          uVar7 = (this->_x).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage
                  .m_rows;
          if (uVar7 != uVar13) {
            __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                          "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                          ,0x2fd,
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, 1>, SrcXprType = Eigen::Matrix<float, -1, 1>, T1 = float, T2 = float]"
                         );
          }
          pfVar8 = (((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&local_58->m_data)->
                   m_storage).m_data;
          uVar13 = uVar7 + 3;
          if (-1 < (long)uVar7) {
            uVar13 = uVar7;
          }
          uVar13 = uVar13 & 0xfffffffffffffffc;
          if (3 < (long)uVar7) {
            lVar14 = 0;
            do {
              pfVar1 = pfVar6 + lVar14;
              uVar9 = *(undefined8 *)(pfVar1 + 2);
              pfVar2 = pfVar8 + lVar14;
              *(undefined8 *)pfVar2 = *(undefined8 *)pfVar1;
              *(undefined8 *)(pfVar2 + 2) = uVar9;
              lVar14 = lVar14 + 4;
            } while (lVar14 < (long)uVar13);
          }
          if ((long)uVar13 < (long)uVar7) {
            do {
              pfVar8[uVar13] = pfVar6[uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar7 != uVar13);
          }
        }
      } while (lVar12 == 0);
      _updateGradient(this);
    } while ((this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols != this->_Np);
  }
  return true;
LAB_0016bcdf:
  __function = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<long, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<long, -1, 1>, Level = 1]"
  ;
  goto LAB_0016bcf4;
LAB_0016bcc8:
  __function = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<float, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<float, -1, 1>, Level = 1]"
  ;
LAB_0016bcf4:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                ,0x1ab,__function);
}

Assistant:

bool NNLS<MatrixType>::solve(const ColVectorType &b, Heuristic heuristic)
{
#ifdef EIGEN3_NNLS_DEBUG
  std::cerr << "NNLS(): Start..." << std::endl;
  _QR.setZero(); _qrCoeffs.setZero();
#endif

  // Initialize solver
  _num_ls = 0; _x.setZero();

  // Together with _Np, P separates the space of coefficients into a active (Z) and passive (P)
  // set. The first _Np elements form the passive set P and the remaining elements form the
  // active set Z.
  _P.setIdentity(); _Np = 0;

  // Precompute A^T*b
  _Atb = _A.transpose() * b;

  // OUTER LOOP
  while (true)
  {
    // Update gradient _w
    _updateGradient();

    // Check if system is solved:
    if ((_A.cols()==_Np) || ((_max_Z(_w)-_epsilon)<0))
      return true;

    switch (heuristic) {
    // find index of max descent and add it to P
    case MAX_DESCENT:
        _addToP(_argmax_Z(_w));
        break;
    }

    // INNER LOOP
    while (true)
    {
      // Check if max. number of iterations is reached
      if ( (0 < _max_iter) && (int(_num_ls) >= _max_iter) )
        return false;

      // Solve LS problem in P only, this step is rather trivial as _addToP & _remFromP
      // updates the QR decomposition of A^P.
      _solveLS_P(b);

      // Check feasability...
      bool feasable = true;
      Scalar alpha = std::numeric_limits<Scalar>::max(); Index remIdx;
      for (Index i=0; i<_Np; i++) {
        Index idx = _P.indices()(i);
        if (_y(idx) < 0) {
          // t shoudl always be in [0,1].
          Scalar t = -_x(idx)/(_y(idx)-_x(idx));
          if (alpha > t) {
            alpha = t;
            remIdx = i;
            feasable = false;
          }
        }
      }

      // If solution is feasable, exit to outer loop
      if (feasable) {
        _x = _y;
        break;
      }

      // Infeasable solution -> interpolate to feasable one
      for (Index i=0; i<_Np; i++) {
        Index idx = _P.indices()(i);
        _x(idx) += alpha * (_y(idx) - _x(idx));
      }

      // Remove these indices from P and update QR decomposition
      _remFromP(remIdx);
    }
  }
}